

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluNativeDisplay.cpp
# Opt level: O1

void __thiscall
eglu::NativeDisplayFactory::NativeDisplayFactory
          (NativeDisplayFactory *this,string *name,string *description,Capability capabilities)

{
  tcu::FactoryBase::FactoryBase(&this->super_FactoryBase,name,description);
  (this->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory =
       (_func_int **)&PTR__NativeDisplayFactory_02167d48;
  tcu::GenericFactoryRegistry::GenericFactoryRegistry(&(this->m_nativeWindowRegistry).m_registry);
  tcu::GenericFactoryRegistry::GenericFactoryRegistry(&(this->m_nativePixmapRegistry).m_registry);
  this->m_capabilities = capabilities;
  this->m_platformType = 0x3038;
  (this->m_platformExtension)._M_dataplus._M_p = (pointer)&(this->m_platformExtension).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->m_platformExtension,0x1b3c1e9);
  return;
}

Assistant:

NativeDisplayFactory::NativeDisplayFactory (const std::string& name, const std::string& description, NativeDisplay::Capability capabilities)
	: FactoryBase			(name, description)
	, m_capabilities		(capabilities)
	, m_platformType		(EGL_NONE)
	, m_platformExtension	("")
{
	DE_ASSERT(!(capabilities & NativeDisplay::CAPABILITY_GET_DISPLAY_PLATFORM));
	DE_ASSERT(capabilities & NativeDisplay::CAPABILITY_GET_DISPLAY_LEGACY);
}